

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STGV.cpp
# Opt level: O2

void __thiscall STGV::visit(STGV *this,ClassDecls *node)

{
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  _Elt_pointer ppAVar3;
  ASTNode **child;
  _Elt_pointer ppAVar4;
  _Map_pointer pppAVar5;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar4 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppAVar5 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppAVar1 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppAVar4 != ppAVar1) {
    (**(*ppAVar4)->_vptr_ASTNode)(*ppAVar4,this);
    ppAVar4 = ppAVar4 + 1;
    if (ppAVar4 == ppAVar3) {
      ppAVar4 = pppAVar5[1];
      pppAVar5 = pppAVar5 + 1;
      ppAVar3 = ppAVar4 + 0x40;
    }
  }
  return;
}

Assistant:

void STGV::visit(ClassDecls *node) {
    for (auto &child : node->getChildren()) child->accept(*this);
}